

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

USTATUS __thiscall FfsParser::parseRawArea(FfsParser *this,UModelIndex *index)

{
  CBString *this_00;
  undefined1 *puVar1;
  TreeModel *pTVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  UINT8 *pUVar6;
  undefined8 uVar7;
  uint uVar8;
  UINT8 UVar9;
  byte bVar10;
  UINT32 UVar11;
  uint uVar12;
  int iVar13;
  USTATUS UVar14;
  vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_> *this_01;
  undefined8 extraout_RAX;
  uint uVar15;
  _Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false> _Var16;
  int32_t pos;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int i;
  TreeModel **ppTVar20;
  UINT8 *buffer;
  insyde_fdm_t *__return_storage_ptr__;
  undefined8 *puVar21;
  long lVar22;
  long *plVar23;
  UINT8 itemType;
  FfsParser *local_638;
  UINT8 prevItemType;
  UModelIndex *local_628;
  ulong local_620;
  CBString name;
  UModelIndex paddingIndex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  _Head_base<0UL,_insyde_fdm_t::fdm_extensions_t_*,_false> local_5d0;
  ulong local_5c8;
  uint local_5c0;
  UINT32 itemSize;
  uint local_5b8;
  UINT32 local_5b4;
  UByteArray fdm;
  UINT32 itemAltSize;
  UINT32 local_584 [3];
  CBString info_1;
  CBString info;
  undefined1 local_538 [32];
  UByteArray header;
  UByteArray data;
  UINT32 prevItemAltSize;
  UByteArray body;
  umemstream is;
  insyde_fdm_t parsed;
  CBString local_280;
  CBString name_1;
  CBString local_250;
  EFI_GUID local_238;
  CBString local_228;
  CBString text;
  UByteArray padding;
  ios_base aiStack_178 [280];
  CBString local_60;
  UModelIndex headerIndex;
  
  if (index->r < 0) {
    return 1;
  }
  if (index->c < 0) {
    return 1;
  }
  if (index->m == (TreeModel *)0x0) {
    return 1;
  }
  local_638 = this;
  TreeModel::body(&data,this->model,index);
  local_628 = index;
  TreeModel::header(&padding,this->model,index);
  local_5c8 = (ulong)(uint)padding.d._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
    operator_delete(padding.d._M_dataplus._M_p);
  }
  Bstrlib::CBString::CBString(&name);
  Bstrlib::CBString::CBString(&info);
  prevItemType = '\0';
  local_5b4 = 0;
  local_584[0] = 0;
  prevItemAltSize = 0;
  UVar14 = findNextRawAreaItem(local_638,local_628,0,&prevItemType,&local_5b4,local_584,
                               &prevItemAltSize);
  if (UVar14 == 0) {
    UVar9 = TreeModel::type(local_638->model,local_628);
    if ((UVar9 == '?') && (UVar9 = TreeModel::subtype(local_638->model,local_628), UVar9 == '\x01'))
    {
      UVar11 = TreeModel::base(local_638->model,local_628);
      uVar19 = (ulong)local_5b4;
      local_638->protectedRegionsBase = UVar11 + uVar19;
    }
    else {
      uVar19 = (ulong)local_5b4;
    }
    uVar15 = (uint)uVar19;
    if (uVar15 != 0) {
      UByteArray::left(&padding,&data,uVar15);
      Bstrlib::CBString::CBString((CBString *)&is,"Padding");
      Bstrlib::CBString::operator=(&name,(CBString *)&is);
      Bstrlib::CBString::~CBString((CBString *)&is);
      usprintf((CBString *)&is,"Full size: %Xh (%u)",(ulong)(uint)padding.d._M_string_length);
      Bstrlib::CBString::operator=(&info,(CBString *)&is);
      Bstrlib::CBString::~CBString((CBString *)&is);
      pTVar2 = local_638->model;
      UVar9 = getPaddingType(&padding);
      Bstrlib::CBString::CBString((CBString *)&paddingIndex);
      puVar1 = &is.super_istream.field_0x10;
      is.super_istream._M_gcount = 0;
      is.super_istream._16_8_ = is.super_istream._16_8_ & 0xffffffffffffff00;
      parsed.super_kstruct.m__io = (kstream *)0x0;
      parsed.m_signature._0_1_ = 0;
      is.super_istream._vptr_basic_istream = (_func_int **)puVar1;
      parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
      TreeModel::addItem((UModelIndex *)&fdm,pTVar2,(UINT32)local_5c8,'@',UVar9,&name,
                         (CBString *)&paddingIndex,&info,(UByteArray *)&is,&padding,
                         (UByteArray *)&parsed,Fixed,local_628,'\0');
      if (parsed.super_kstruct._vptr_kstruct != (_func_int **)&parsed.m_signature) {
        operator_delete(parsed.super_kstruct._vptr_kstruct);
      }
      if (is.super_istream._vptr_basic_istream != (_func_int **)puVar1) {
        operator_delete(is.super_istream._vptr_basic_istream);
      }
      Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
        operator_delete(padding.d._M_dataplus._M_p);
      }
    }
    itemType = prevItemType;
    local_5d0._M_head_impl._4_4_ = 0;
    local_5d0._M_head_impl._0_4_ = local_584[0];
    itemSize = local_584[0];
    itemAltSize = prevItemAltSize;
    this_00 = &local_638->securityInfo;
    this_01 = &local_638->protectedRanges;
    UVar14 = 0;
    local_5b8 = uVar15;
    while( true ) {
      iVar18 = (int)uVar19;
      uVar15 = (uint)local_5d0._M_head_impl;
      if (UVar14 != 0) break;
      local_620 = (ulong)local_5b8;
      uVar15 = uVar15 + iVar18;
      if (uVar15 <= local_5b8 && local_5b8 - uVar15 != 0) {
        UByteArray::mid(&padding,&data,uVar15,local_5b8 - uVar15);
        Bstrlib::CBString::CBString((CBString *)&is,"Padding");
        Bstrlib::CBString::operator=(&name,(CBString *)&is);
        Bstrlib::CBString::~CBString((CBString *)&is);
        usprintf((CBString *)&is,"Full size: %Xh (%u)",(ulong)(uint)padding.d._M_string_length);
        Bstrlib::CBString::operator=(&info,(CBString *)&is);
        Bstrlib::CBString::~CBString((CBString *)&is);
        pTVar2 = local_638->model;
        UVar9 = getPaddingType(&padding);
        Bstrlib::CBString::CBString((CBString *)&paddingIndex);
        is.super_istream._vptr_basic_istream = (_func_int **)&is.super_istream.field_0x10;
        is.super_istream._M_gcount = 0;
        is.super_istream._16_8_ = is.super_istream._16_8_ & 0xffffffffffffff00;
        parsed.super_kstruct.m__io = (kstream *)0x0;
        parsed.m_signature._0_1_ = 0;
        parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
        TreeModel::addItem((UModelIndex *)&fdm,pTVar2,uVar15 + (int)local_5c8,'@',UVar9,&name,
                           (CBString *)&paddingIndex,&info,(UByteArray *)&is,&padding,
                           (UByteArray *)&parsed,Fixed,local_628,'\0');
        if (parsed.super_kstruct._vptr_kstruct != (_func_int **)&parsed.m_signature) {
          operator_delete(parsed.super_kstruct._vptr_kstruct);
        }
        if (is.super_istream._vptr_basic_istream != (_func_int **)&is.super_istream.field_0x10) {
          operator_delete(is.super_istream._vptr_basic_istream);
        }
        Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
          operator_delete(padding.d._M_dataplus._M_p);
        }
      }
      _Var16._M_head_impl._4_4_ = 0;
      _Var16._M_head_impl._0_4_ = itemSize;
      pos = (int32_t)local_620;
      if (((uint)data.d._M_string_length < itemSize) ||
         (uVar15 = itemSize + pos, (uint)data.d._M_string_length < uVar15)) {
        UByteArray::mid(&padding,&data,pos,-1);
        Bstrlib::CBString::CBString((CBString *)&is,"Padding");
        Bstrlib::CBString::operator=(&name,(CBString *)&is);
        Bstrlib::CBString::~CBString((CBString *)&is);
        usprintf((CBString *)&is,"Full size: %Xh (%u)",(ulong)(uint)padding.d._M_string_length);
        Bstrlib::CBString::operator=(&info,(CBString *)&is);
        Bstrlib::CBString::~CBString((CBString *)&is);
        pTVar2 = local_638->model;
        UVar9 = getPaddingType(&padding);
        Bstrlib::CBString::CBString((CBString *)&fdm);
        is.super_istream._vptr_basic_istream = (_func_int **)&is.super_istream.field_0x10;
        is.super_istream._M_gcount = 0;
        is.super_istream._16_8_ = is.super_istream._16_8_ & 0xffffffffffffff00;
        parsed.super_kstruct.m__io = (kstream *)0x0;
        parsed.m_signature._0_1_ = 0;
        parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
        TreeModel::addItem(&paddingIndex,pTVar2,(int)local_620 + (int)local_5c8,'@',UVar9,&name,
                           (CBString *)&fdm,&info,(UByteArray *)&is,&padding,(UByteArray *)&parsed,
                           Fixed,local_628,'\0');
        if (parsed.super_kstruct._vptr_kstruct != (_func_int **)&parsed.m_signature) {
          operator_delete(parsed.super_kstruct._vptr_kstruct);
        }
        iVar18 = (int)local_620;
        if (is.super_istream._vptr_basic_istream != (_func_int **)&is.super_istream.field_0x10) {
          operator_delete(is.super_istream._vptr_basic_istream);
        }
        Bstrlib::CBString::~CBString((CBString *)&fdm);
        usprintf((CBString *)&is,"%s: one of objects inside overlaps the end of data","parseRawArea"
                );
        msg(local_638,(CBString *)&is,&paddingIndex);
        Bstrlib::CBString::~CBString((CBString *)&is);
        uVar15 = (uint)padding.d._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
          operator_delete(padding.d._M_dataplus._M_p);
        }
        break;
      }
      local_5d0._M_head_impl = _Var16._M_head_impl;
      if (itemType < 0x55) {
        if (itemType == 'A') {
          is.super_istream._vptr_basic_istream = (_func_int **)0xffffffffffffffff;
          is.super_istream._M_gcount = 0;
          is.super_istream._16_8_ = 0;
          UByteArray::mid(&padding,&data,pos,itemSize);
          UVar14 = parseVolumeHeader(local_638,&padding,pos + (int)local_5c8,local_628,
                                     (UModelIndex *)&is.super_istream);
          if (UVar14 == 0) {
            if ((UINT32)local_5d0._M_head_impl != itemAltSize) {
              __return_storage_ptr__ = &parsed;
              usprintf((CBString *)__return_storage_ptr__,
                       "%s: volume size stored in header %Xh differs from calculated using block map %Xh"
                       ,"parseRawArea",local_5d0._M_head_impl);
              msg(local_638,(CBString *)__return_storage_ptr__,(UModelIndex *)&is.super_istream);
              goto LAB_00128272;
            }
          }
          else {
            usprintf((CBString *)&paddingIndex,"%s: volume header parsing failed with error ",
                     "parseRawArea");
            errorCodeToUString((CBString *)&fdm,UVar14);
            Bstrlib::CBString::operator+
                      ((CBString *)&parsed,(CBString *)&paddingIndex,(CBString *)&fdm);
            msg(local_638,(CBString *)&parsed,local_628);
            Bstrlib::CBString::~CBString((CBString *)&parsed);
            Bstrlib::CBString::~CBString((CBString *)&fdm);
            __return_storage_ptr__ = (insyde_fdm_t *)&paddingIndex;
LAB_00128272:
            Bstrlib::CBString::~CBString((CBString *)__return_storage_ptr__);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
            operator_delete(padding.d._M_dataplus._M_p);
          }
          prevItemType = 'A';
        }
        else {
          if (itemType != 'L') goto LAB_00128a55;
          UByteArray::mid(&fdm,&data,pos,itemSize);
          umemstream::umemstream
                    ((umemstream *)&is.super_istream,fdm.d._M_dataplus._M_p,
                     (long)(int)(uint)fdm.d._M_string_length);
          kaitai::kstream::kstream((kstream *)&padding,&is.super_istream);
          insyde_fdm_t::insyde_fdm_t(&parsed,(kstream *)&padding,(kstruct *)0x0,(insyde_fdm_t *)0x0)
          ;
          uVar17 = (uint)fdm.d._M_string_length;
          UByteArray::left(&header,&fdm,parsed.m_data_offset);
          UByteArray::mid(&body,&fdm,(uint)header.d._M_string_length,
                          uVar17 - (uint)header.d._M_string_length);
          Bstrlib::CBString::CBString(&name_1,"Insyde H2O FlashDeviceMap");
          local_584._4_8_ = ZEXT18(parsed.m_entry_format);
          usprintf(&info_1,
                   "Signature: HFDM\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nData offset: %Xh\nEntry size: %Xh (%u)\nEntry format: %02Xh\nRevision: %02Xh\nExtension count: %u\nFlash descriptor base address: %08Xh\nChecksum: %02Xh"
                   ,(ulong)uVar17,(ulong)uVar17,(ulong)(uint)header.d._M_string_length,
                   (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
                   (ulong)(uint)body.d._M_string_length,(ulong)parsed.m_data_offset,
                   (ulong)parsed.m_entry_size,(ulong)parsed.m_entry_size,local_584._4_8_,
                   (ulong)parsed.m_revision,(ulong)parsed.m_num_extensions,
                   (ulong)(uint)parsed.m_fd_base_address,(ulong)parsed.m_checksum);
          ppTVar20 = &paddingIndex.m;
          UByteArray::mid((UByteArray *)&paddingIndex,&data,(int32_t)local_620,0x1c);
          pUVar6 = (UINT8 *)CONCAT53(paddingIndex.i._3_5_,
                                     CONCAT12(paddingIndex.i._2_1_,(undefined2)paddingIndex.i));
          buffer = pUVar6;
          if (pUVar6 != (UINT8 *)0x0) {
            buffer = (UINT8 *)paddingIndex._0_8_;
          }
          buffer[0x13] = '\0';
          bVar10 = calculateChecksum8(buffer,(UINT32)pUVar6);
          if (bVar10 == parsed.m_checksum) {
            Bstrlib::CBString::CBString((CBString *)local_538,", valid");
            Bstrlib::CBString::operator+=(&info_1,(CBString *)local_538);
          }
          else {
            usprintf((CBString *)local_538,", invalid, should be %02Xh",(ulong)bVar10);
            Bstrlib::CBString::operator+=(&info_1,(CBString *)local_538);
          }
          Bstrlib::CBString::~CBString((CBString *)local_538);
          if ((TreeModel **)paddingIndex._0_8_ != ppTVar20) {
            operator_delete((void *)paddingIndex._0_8_);
          }
          if (parsed.n_board_ids == false) {
            usprintf((CBString *)&paddingIndex,"\nRegion index: %Xh\nBoardId Count: %u",
                     (ulong)*(uint *)((long)parsed.m_board_ids._M_t.
                                            super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                            .
                                            super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>
                                            ._M_head_impl + 0x10),
                     (ulong)*(uint *)((long)parsed.m_board_ids._M_t.
                                            super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                            .
                                            super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>
                                            ._M_head_impl + 0x14));
            Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
            Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
            puVar21 = (undefined8 *)
                      **(long **)((long)parsed.m_board_ids._M_t.
                                        super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                        .
                                        super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>
                                        ._M_head_impl + 0x18);
            puVar3 = (undefined8 *)
                     (*(long **)((long)parsed.m_board_ids._M_t.
                                       super___uniq_ptr_impl<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
                                       .
                                       super__Head_base<0UL,_insyde_fdm_t::fdm_board_ids_t_*,_false>
                                       ._M_head_impl + 0x18))[1];
            if (puVar21 != puVar3) {
              uVar17 = 0;
              do {
                usprintf((CBString *)&paddingIndex,"\nBoardId #%u: %lX\n",(ulong)uVar17,*puVar21);
                Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
                Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
                puVar21 = puVar21 + 1;
                uVar17 = uVar17 + 1;
              } while (puVar21 != puVar3);
            }
          }
          pTVar2 = local_638->model;
          Bstrlib::CBString::CBString((CBString *)local_538);
          paddingIndex.i._0_2_ = 0;
          paddingIndex.i._2_1_ = 0;
          paddingIndex.i._3_5_ = 0;
          paddingIndex.m = (TreeModel *)((ulong)paddingIndex.m & 0xffffffffffffff00);
          paddingIndex._0_8_ = ppTVar20;
          TreeModel::addItem(&headerIndex,pTVar2,(int)local_620 + (int)local_5c8,'L','\0',&name_1,
                             (CBString *)local_538,&info_1,&header,&body,(UByteArray *)&paddingIndex
                             ,Fixed,local_628,'\0');
          if ((TreeModel **)paddingIndex._0_8_ != ppTVar20) {
            operator_delete((void *)paddingIndex._0_8_);
          }
          Bstrlib::CBString::~CBString((CBString *)local_538);
          plVar23 = (long *)**(long **)((long)parsed.m_entries._M_t.
                                              super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                              .
                                              super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>
                                              ._M_head_impl + 0x10);
          plVar4 = (long *)(*(long **)((long)parsed.m_entries._M_t.
                                             super___uniq_ptr_impl<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_insyde_fdm_t::fdm_entries_t_*,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
                                             .
                                             super__Head_base<0UL,_insyde_fdm_t::fdm_entries_t_*,_false>
                                             ._M_head_impl + 0x10))[1];
          if (plVar23 != plVar4) {
            local_5c0 = 0;
            uVar17 = parsed.m_data_offset;
            do {
              ppTVar20 = &paddingIndex.m;
              lVar22 = *(long *)(*plVar23 + 0x18);
              paddingIndex._0_8_ = ppTVar20;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&paddingIndex,lVar22,*(long *)(*plVar23 + 0x20) + lVar22);
              local_238._0_8_ = *(undefined8 *)paddingIndex._0_8_;
              local_238.Data4 = *(UINT8 (*) [8])(paddingIndex._0_8_ + 8);
              if ((TreeModel **)paddingIndex._0_8_ != ppTVar20) {
                operator_delete((void *)paddingIndex._0_8_);
              }
              insydeFlashDeviceMapEntryTypeGuidToUString((CBString *)&paddingIndex,&local_238);
              Bstrlib::CBString::operator=(&name_1,(CBString *)&paddingIndex);
              Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
              Bstrlib::CBString::CBString(&text);
              iVar18 = uVar17 + (int)local_620;
              local_584._4_8_ = (ulong)uVar17;
              UByteArray::mid((UByteArray *)&paddingIndex,&data,iVar18,0x34);
              std::__cxx11::string::_M_assign((string *)&header);
              if ((TreeModel **)paddingIndex._0_8_ != ppTVar20) {
                operator_delete((void *)paddingIndex._0_8_);
              }
              UByteArray::mid((UByteArray *)&paddingIndex,&data,
                              iVar18 + (uint)header.d._M_string_length,
                              parsed.m_entry_size - (uint)header.d._M_string_length);
              std::__cxx11::string::_M_assign((string *)&body);
              if ((TreeModel **)paddingIndex._0_8_ != ppTVar20) {
                operator_delete((void *)paddingIndex._0_8_);
              }
              uVar17 = (uint)body.d._M_string_length + (uint)header.d._M_string_length;
              Bstrlib::CBString::CBString(&local_250,"Region type: ");
              guidToUString(&local_280,&local_238,false);
              Bstrlib::CBString::operator+((CBString *)local_538,&local_250,&local_280);
              Bstrlib::CBString::operator+((CBString *)&paddingIndex,(CBString *)local_538,"\n");
              Bstrlib::CBString::operator=(&info_1,(CBString *)&paddingIndex);
              Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
              Bstrlib::CBString::~CBString((CBString *)local_538);
              Bstrlib::CBString::~CBString(&local_280);
              Bstrlib::CBString::~CBString(&local_250);
              Bstrlib::CBString::CBString((CBString *)&paddingIndex,"Region id: ");
              Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
              Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
              lVar22 = 0;
              do {
                lVar5 = *(long *)(*plVar23 + 0x38);
                paddingIndex._0_8_ = ppTVar20;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&paddingIndex,lVar5,*(long *)(*plVar23 + 0x40) + lVar5);
                usprintf((CBString *)local_538,"%02X",(ulong)*(byte *)(paddingIndex._0_8_ + lVar22))
                ;
                Bstrlib::CBString::operator+=(&info_1,(CBString *)local_538);
                Bstrlib::CBString::~CBString((CBString *)local_538);
                if ((TreeModel **)paddingIndex._0_8_ != ppTVar20) {
                  operator_delete((void *)paddingIndex._0_8_);
                }
                uVar8 = (uint)header.d._M_string_length;
                lVar22 = lVar22 + 1;
              } while (lVar22 != 0x10);
              uVar7 = CONCAT44(body.d._M_string_length._4_4_,(uint)body.d._M_string_length);
              uVar12 = insyde_fdm_t::fdm_entry_t::region_base((fdm_entry_t *)*plVar23);
              usprintf((CBString *)&paddingIndex,
                       "\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nRegion address: %08Xh\nRegion size: %08Xh\nAttributes: %08Xh"
                       ,(ulong)uVar17,(ulong)uVar17,uVar8,uVar8,uVar7,uVar7,(ulong)uVar12,
                       (ulong)*(uint *)(*plVar23 + 0x60),(ulong)*(uint *)(*plVar23 + 0x68));
              Bstrlib::CBString::operator+=(&info_1,(CBString *)&paddingIndex);
              Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
              if ((*(byte *)(*plVar23 + 0x68) & 1) == 0) {
                if ((local_5c0 & 1) == 0) {
                  UVar11 = TreeModel::base(local_638->model,&headerIndex);
                  usprintf((CBString *)&paddingIndex,
                           "Insyde Flash Device Map found at base %08Xh\nProtected ranges:\n",
                           (ulong)UVar11);
                  Bstrlib::CBString::operator+=(this_00,(CBString *)&paddingIndex);
                  Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
                  local_5c0 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                }
                paddingIndex.r = 0;
                paddingIndex.c = 0;
                paddingIndex.i._0_2_ = 0;
                paddingIndex.i._2_1_ = 0;
                paddingIndex.m = (TreeModel *)&local_5e0;
                local_5e0._M_local_buf[0] = '\0';
                paddingIndex.r = insyde_fdm_t::fdm_entry_t::region_base((fdm_entry_t *)*plVar23);
                paddingIndex.c = *(int *)(*plVar23 + 0x60);
                paddingIndex.i._0_2_ = 0xb;
                paddingIndex.i._2_1_ = 9;
                std::__cxx11::string::_M_assign((string *)&paddingIndex.m);
                std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                          (this_01,(value_type *)&paddingIndex);
                usprintf(&local_228,"Address: %08Xh Size: %Xh\nHash: ",(ulong)(uint)paddingIndex.r,
                         (ulong)(uint)paddingIndex.c);
                UByteArray::toHex((UByteArray *)local_538,&body);
                Bstrlib::CBString::CBString(&local_60,(char *)local_538._0_8_);
                Bstrlib::CBString::operator+(&local_280,&local_228,&local_60);
                Bstrlib::CBString::operator+(&local_250,&local_280,"\n");
                Bstrlib::CBString::operator+=(this_00,&local_250);
                Bstrlib::CBString::~CBString(&local_250);
                Bstrlib::CBString::~CBString(&local_280);
                Bstrlib::CBString::~CBString(&local_60);
                if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
                  operator_delete((void *)local_538._0_8_);
                }
                Bstrlib::CBString::~CBString(&local_228);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)paddingIndex.m != &local_5e0) {
                  operator_delete(paddingIndex.m);
                }
              }
              paddingIndex.i._0_2_ = 0;
              paddingIndex.i._2_1_ = 0;
              paddingIndex.i._3_5_ = 0;
              paddingIndex.m = (TreeModel *)((ulong)paddingIndex.m & 0xffffffffffffff00);
              paddingIndex._0_8_ = &paddingIndex.m;
              TreeModel::addItem((UModelIndex *)local_538,local_638->model,(UINT32)local_584._4_8_,
                                 'T','\0',&name_1,&text,&info_1,&header,&body,
                                 (UByteArray *)&paddingIndex,Fixed,&headerIndex,'\0');
              if ((TreeModel **)paddingIndex._0_8_ != &paddingIndex.m) {
                operator_delete((void *)paddingIndex._0_8_);
              }
              uVar17 = (int)local_584._4_8_ + uVar17;
              Bstrlib::CBString::~CBString(&text);
              plVar23 = plVar23 + 1;
            } while (plVar23 != plVar4);
            if ((local_5c0 & 1) != 0) {
              Bstrlib::CBString::operator+=(this_00,"\n");
            }
          }
          Bstrlib::CBString::~CBString(&info_1);
          Bstrlib::CBString::~CBString(&name_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)body.d._M_dataplus._M_p != &body.d.field_2) {
            operator_delete(body.d._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)header.d._M_dataplus._M_p != &header.d.field_2) {
            operator_delete(header.d._M_dataplus._M_p);
          }
          insyde_fdm_t::~insyde_fdm_t(&parsed);
          std::__cxx11::istringstream::~istringstream((istringstream *)&padding.d._M_string_length);
          std::ios_base::~ios_base(aiStack_178);
          is.super_istream._vptr_basic_istream = (_func_int **)&PTR__umemstream_001a9708;
          is.super_istream._80_8_ = &PTR__umemstream_001a9730;
          is.super_istream._16_8_ = std::streambuf::overflow;
          std::locale::~locale((locale *)&is.super_istream.field_0x48);
          is.super_istream._vptr_basic_istream =
               (_func_int **)(std::istream-in-umemstream::construction_vtable + 0x18);
          is.super_istream._80_8_ = 0x1a9780;
          is.super_istream._M_gcount = 0;
          std::ios_base::~ios_base((ios_base *)&is.super_istream.field_0x50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fdm.d._M_dataplus._M_p != &fdm.d.field_2) {
            operator_delete(fdm.d._M_dataplus._M_p);
          }
          prevItemType = 'L';
        }
      }
      else if (itemType == 'U') {
        is.super_istream._vptr_basic_istream = (_func_int **)0xffffffffffffffff;
        is.super_istream._M_gcount = 0;
        is.super_istream._16_8_ = 0;
        UByteArray::mid(&padding,&data,pos,itemSize);
        UVar14 = parseIntelMicrocodeHeader
                           (local_638,&padding,pos + (int)local_5c8,local_628,
                            (UModelIndex *)&is.super_istream);
        if (UVar14 != 0) {
          usprintf((CBString *)&paddingIndex,"%s: microcode header parsing failed with error ",
                   "parseRawArea");
          errorCodeToUString((CBString *)&fdm,UVar14);
          Bstrlib::CBString::operator+
                    ((CBString *)&parsed,(CBString *)&paddingIndex,(CBString *)&fdm);
          msg(local_638,(CBString *)&parsed,local_628);
          Bstrlib::CBString::~CBString((CBString *)&parsed);
          Bstrlib::CBString::~CBString((CBString *)&fdm);
          Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
          operator_delete(padding.d._M_dataplus._M_p);
        }
        prevItemType = 'U';
      }
      else {
        if (itemType != '\\') goto LAB_00128a55;
        UByteArray::mid(&padding,&data,pos,itemSize);
        Bstrlib::CBString::CBString((CBString *)&is.super_istream,"BPDT region");
        Bstrlib::CBString::operator=(&name,(CBString *)&is.super_istream);
        Bstrlib::CBString::~CBString((CBString *)&is.super_istream);
        usprintf((CBString *)&is.super_istream,"Full size: %Xh (%u)",
                 (ulong)(uint)padding.d._M_string_length);
        Bstrlib::CBString::operator=(&info,(CBString *)&is.super_istream);
        Bstrlib::CBString::~CBString((CBString *)&is.super_istream);
        pTVar2 = local_638->model;
        Bstrlib::CBString::CBString((CBString *)&fdm);
        is.super_istream._vptr_basic_istream = (_func_int **)&is.super_istream.field_0x10;
        is.super_istream._M_gcount = 0;
        is.super_istream._16_8_ = is.super_istream._16_8_ & 0xffffffffffffff00;
        parsed.super_kstruct.m__io = (kstream *)0x0;
        parsed.m_signature._0_1_ = 0;
        parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
        TreeModel::addItem(&paddingIndex,pTVar2,(int)local_620 + (int)local_5c8,'\\','\0',&name,
                           (CBString *)&fdm,&info,(UByteArray *)&is.super_istream,&padding,
                           (UByteArray *)&parsed,Fixed,local_628,'\0');
        if (parsed.super_kstruct._vptr_kstruct != (_func_int **)&parsed.m_signature) {
          operator_delete(parsed.super_kstruct._vptr_kstruct);
        }
        if (is.super_istream._vptr_basic_istream != (_func_int **)&is.super_istream.field_0x10) {
          operator_delete(is.super_istream._vptr_basic_istream);
        }
        Bstrlib::CBString::~CBString((CBString *)&fdm);
        is.super_istream._vptr_basic_istream = (_func_int **)0xffffffffffffffff;
        is.super_istream._M_gcount = 0;
        is.super_istream._16_8_ = 0;
        UVar14 = parseBpdtRegion(local_638,&padding,0,0,&paddingIndex,
                                 (UModelIndex *)&is.super_istream);
        if (UVar14 != 0) {
          usprintf((CBString *)&fdm,"%s: BPDT store parsing failed with error ","parseRawArea");
          errorCodeToUString((CBString *)&header,UVar14);
          Bstrlib::CBString::operator+((CBString *)&parsed,(CBString *)&fdm,(CBString *)&header);
          msg(local_638,(CBString *)&parsed,local_628);
          Bstrlib::CBString::~CBString((CBString *)&parsed);
          Bstrlib::CBString::~CBString((CBString *)&header);
          Bstrlib::CBString::~CBString((CBString *)&fdm);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
          operator_delete(padding.d._M_dataplus._M_p);
        }
        prevItemType = '\\';
      }
      uVar19 = local_620;
      local_5b4 = (UINT32)local_620;
      local_584[0] = (UINT32)local_5d0._M_head_impl;
      UVar14 = findNextRawAreaItem(local_638,local_628,uVar15,&itemType,&local_5b8,&itemSize,
                                   &itemAltSize);
    }
    uVar15 = uVar15 + iVar18;
    if (uVar15 < (uint)data.d._M_string_length) {
      UByteArray::mid(&padding,&data,uVar15,-1);
      Bstrlib::CBString::CBString((CBString *)&is,"Padding");
      Bstrlib::CBString::operator=(&name,(CBString *)&is);
      Bstrlib::CBString::~CBString((CBString *)&is);
      usprintf((CBString *)&is,"Full size: %Xh (%u)",(ulong)(uint)padding.d._M_string_length);
      Bstrlib::CBString::operator=(&info,(CBString *)&is);
      Bstrlib::CBString::~CBString((CBString *)&is);
      pTVar2 = local_638->model;
      UVar9 = getPaddingType(&padding);
      Bstrlib::CBString::CBString((CBString *)&paddingIndex);
      is.super_istream._vptr_basic_istream = (_func_int **)&is.super_istream.field_0x10;
      is.super_istream._M_gcount = 0;
      is.super_istream._16_8_ = is.super_istream._16_8_ & 0xffffffffffffff00;
      parsed.super_kstruct.m__io = (kstream *)0x0;
      parsed.m_signature._0_1_ = 0;
      parsed.super_kstruct._vptr_kstruct = (_func_int **)&parsed.m_signature;
      TreeModel::addItem((UModelIndex *)&fdm,pTVar2,uVar15 + (int)local_5c8,'@',UVar9,&name,
                         (CBString *)&paddingIndex,&info,(UByteArray *)&is,&padding,
                         (UByteArray *)&parsed,Fixed,local_628,'\0');
      if (parsed.super_kstruct._vptr_kstruct != (_func_int **)&parsed.m_signature) {
        operator_delete(parsed.super_kstruct._vptr_kstruct);
      }
      if (is.super_istream._vptr_basic_istream != (_func_int **)&is.super_istream.field_0x10) {
        operator_delete(is.super_istream._vptr_basic_istream);
      }
      Bstrlib::CBString::~CBString((CBString *)&paddingIndex);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)padding.d._M_dataplus._M_p != &padding.d.field_2) {
        operator_delete(padding.d._M_dataplus._M_p);
      }
    }
    UVar14 = 0;
    iVar18 = 0;
    while( true ) {
      iVar13 = TreeModel::rowCount(local_638->model,local_628);
      if (iVar13 <= iVar18) break;
      TreeModel::index((TreeModel *)&padding,(char *)local_628->m,iVar18);
      bVar10 = TreeModel::type(local_638->model,(UModelIndex *)&padding);
      uVar15 = bVar10 - 0x40;
      if (0x1e < uVar15) goto LAB_00128a55;
      if ((0x50201001U >> (uVar15 & 0x1f) & 1) == 0) {
        if (uVar15 != 1) goto LAB_00128a55;
        parseVolumeBody(local_638,(UModelIndex *)&padding);
      }
      iVar18 = iVar18 + 1;
    }
  }
  else {
    UVar14 = 0;
  }
LAB_00126fa7:
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data.d._M_dataplus._M_p != &data.d.field_2) {
    operator_delete(data.d._M_dataplus._M_p);
  }
  return UVar14;
LAB_00128a55:
  UVar14 = 9;
  goto LAB_00126fa7;
}

Assistant:

USTATUS FfsParser::parseRawArea(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Get item data
    UByteArray data = model->body(index);
    UINT32 headerSize = (UINT32)model->header(index).size();
    
    USTATUS result;
    UString name;
    UString info;
    
    // Search for the first item
    UINT8  prevItemType = 0;
    UINT32 prevItemOffset = 0;
    UINT32 prevItemSize = 0;
    UINT32 prevItemAltSize = 0;
    
    result = findNextRawAreaItem(index, 0, prevItemType, prevItemOffset, prevItemSize, prevItemAltSize);
    if (result) {
        // No need to parse further
        return U_SUCCESS;
    }
    
    // Set base of protected regions to be the first volume
    if (model->type(index) == Types::Region
        && model->subtype(index) == Subtypes::BiosRegion) {
        protectedRegionsBase = (UINT64)model->base(index) + prevItemOffset;
    }
    
    // First item is not at the beginning of this raw area
    if (prevItemOffset > 0) {
        // Get info
        UByteArray padding = data.left(prevItemOffset);
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(headerSize, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
    }
    
    // Search for and parse all items
    UINT8  itemType = prevItemType;
    UINT32 itemOffset = prevItemOffset;
    UINT32 itemSize = prevItemSize;
    UINT32 itemAltSize = prevItemAltSize;
    
    while (!result) {
        // Padding between items
        if (itemOffset > prevItemOffset + prevItemSize) {
            UINT32 paddingOffset = prevItemOffset + prevItemSize;
            UINT32 paddingSize = itemOffset - paddingOffset;
            UByteArray padding = data.mid(paddingOffset, paddingSize);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            model->addItem(headerSize + paddingOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
        }
        
        // Check that item is fully present in input
        if (itemSize > (UINT32)data.size() || itemOffset + itemSize > (UINT32)data.size()) {
            // Mark the rest as padding and finish parsing
            UByteArray padding = data.mid(itemOffset);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            UModelIndex paddingIndex = model->addItem(headerSize + itemOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
            msg(usprintf("%s: one of objects inside overlaps the end of data", __FUNCTION__), paddingIndex);
            
            // Update variables
            prevItemOffset = itemOffset;
            prevItemSize = (UINT32)padding.size();
            break;
        }
        
        // Parse current volume header
        if (itemType == Types::Volume) {
            UModelIndex volumeIndex;
            UByteArray volume = data.mid(itemOffset, itemSize);
            result = parseVolumeHeader(volume, headerSize + itemOffset, index, volumeIndex);
            if (result) {
                msg(usprintf("%s: volume header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            } else {
                // Show messages
                if (itemSize != itemAltSize)
                    msg(usprintf("%s: volume size stored in header %Xh differs from calculated using block map %Xh", __FUNCTION__,
                                 itemSize, itemAltSize),
                        volumeIndex);
            }
        }
        else if (itemType == Types::Microcode) {
            UModelIndex microcodeIndex;
            UByteArray microcode = data.mid(itemOffset, itemSize);
            result = parseIntelMicrocodeHeader(microcode, headerSize + itemOffset, index, microcodeIndex);
            if (result) {
                msg(usprintf("%s: microcode header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            }
        }
        else if (itemType == Types::BpdtStore) {
            UByteArray bpdtStore = data.mid(itemOffset, itemSize);
            
            // Get info
            name = UString("BPDT region");
            info = usprintf("Full size: %Xh (%u)", (UINT32)bpdtStore.size(), (UINT32)bpdtStore.size());
            
            // Add tree item
            UModelIndex bpdtIndex = model->addItem(headerSize + itemOffset, Types::BpdtStore, 0, name, UString(), info, UByteArray(), bpdtStore, UByteArray(), Fixed, index);
            
            // Parse BPDT region
            UModelIndex bpdtPtIndex;
            result = parseBpdtRegion(bpdtStore, 0, 0, bpdtIndex, bpdtPtIndex);
            if (result) {
                msg(usprintf("%s: BPDT store parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
            }
        }
        else if (itemType == Types::InsydeFlashDeviceMapStore) {
            try {
                UByteArray fdm = data.mid(itemOffset, itemSize);
                umemstream is(fdm.constData(), fdm.size());
                kaitai::kstream ks(&is);
                insyde_fdm_t parsed(&ks);
                UINT32 storeSize = (UINT32)fdm.size();
                
                // Construct header and body
                UByteArray header = fdm.left(parsed.data_offset());
                UByteArray body = fdm.mid(header.size(), storeSize - header.size());
                
                // Add info
                UString name = UString("Insyde H2O FlashDeviceMap");
                UString info = usprintf("Signature: HFDM\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nData offset: %Xh\nEntry size: %Xh (%u)\nEntry format: %02Xh\nRevision: %02Xh\nExtension count: %u\nFlash descriptor base address: %08Xh\nChecksum: %02Xh",
                                        storeSize, storeSize,
                                        (UINT32)header.size(), (UINT32)header.size(),
                                        (UINT32)body.size(), (UINT32)body.size(),
                                        parsed.data_offset(),
                                        parsed.entry_size(), parsed.entry_size(),
                                        parsed.entry_format(),
                                        parsed.revision(),
                                        parsed.num_extensions(),
                                        (UINT32)parsed.fd_base_address(),
                                        parsed.checksum());
                
                // Check header checksum
                {
                    UByteArray tempHeader = data.mid(itemOffset, sizeof(INSYDE_FLASH_DEVICE_MAP_HEADER));
                    INSYDE_FLASH_DEVICE_MAP_HEADER* tempFdmHeader = (INSYDE_FLASH_DEVICE_MAP_HEADER*)tempHeader.data();
                    tempFdmHeader->Checksum = 0;
                    UINT8 calculated = calculateChecksum8((const UINT8*)tempFdmHeader, (UINT32)tempHeader.size());
                    if (calculated == parsed.checksum()) {
                        info += UString(", valid");
                    }
                    else {
                        info += usprintf(", invalid, should be %02Xh", calculated);
                    }
                }
                
                // Add board IDs
                if (!parsed._is_null_board_ids()) {
                    info += usprintf("\nRegion index: %Xh\nBoardId Count: %u",
                                     parsed.board_ids()->region_index(),
                                     parsed.board_ids()->num_board_ids());
                    UINT32 i = 0;
                    for (const auto & boardId : *parsed.board_ids()->board_ids()) {
                        info += usprintf("\nBoardId #%u: %" PRIX64 "\n", i++, boardId);
                    }
                }
                
                // Add header tree item
                UModelIndex headerIndex = model->addItem(headerSize + itemOffset, Types::InsydeFlashDeviceMapStore, 0, name, UString(), info, header, body, UByteArray(), Fixed, index);
                
                // Add entries
                UINT32 entryOffset = parsed.data_offset();
                bool protectedRangeFound = false;
                for (const auto & entry : *parsed.entries()->entries()) {
                    const EFI_GUID guid = readUnaligned((const EFI_GUID*)entry->guid().c_str());
                    name = insydeFlashDeviceMapEntryTypeGuidToUString(guid);
                    UString text;
                    header = data.mid(itemOffset + entryOffset, sizeof(INSYDE_FLASH_DEVICE_MAP_ENTRY));
                    body = data.mid(itemOffset + entryOffset + header.size(), parsed.entry_size() - header.size());
                    
                    // Add info
                    UINT32 entrySize = (UINT32)header.size() + (UINT32)body.size();
                    info = UString("Region type: ") + guidToUString(guid, false) + "\n";
                    info += UString("Region id: ");
                    for (UINT8 i = 0; i < 16; i++) {
                        info += usprintf("%02X", *(const UINT8*)(entry->region_id().c_str() + i));
                    }
                    info += usprintf("\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nRegion address: %08Xh\nRegion size: %08Xh\nAttributes: %08Xh",
                                     entrySize, entrySize,
                                     (UINT32)header.size(), (UINT32)header.size(),
                                     (UINT32)body.size(), (UINT32)body.size(),
                                     (UINT32)entry->region_base(),
                                     (UINT32)entry->region_size(),
                                     entry->attributes());
                    
                    if ((entry->attributes() & INSYDE_FLASH_DEVICE_MAP_ENTRY_ATTRIBUTE_MODIFIABLE) == 0) {
                        if (!protectedRangeFound) {
                            securityInfo += usprintf("Insyde Flash Device Map found at base %08Xh\nProtected ranges:\n", model->base(headerIndex));
                            protectedRangeFound = true;
                        }
                        
                        // TODO: make sure that the only hash possible here is SHA256
                        
                        // Add this region to the list of Insyde protected regions
                        PROTECTED_RANGE range = {};
                        range.Offset = (UINT32)entry->region_base();
                        range.Size = (UINT32)entry->region_size();
                        range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                        range.Type = PROTECTED_RANGE_VENDOR_HASH_INSYDE;
                        range.Hash = body;
                        protectedRanges.push_back(range);
                        
                        securityInfo += usprintf("Address: %08Xh Size: %Xh\nHash: ", range.Offset, range.Size) + UString(body.toHex().constData()) + "\n";
                    }
                    
                    // Add tree item
                    model->addItem(entryOffset, Types::InsydeFlashDeviceMapEntry, 0, name, text, info, header, body, UByteArray(), Fixed, headerIndex);
                    
                    entryOffset += entrySize;
                }
                
                if (protectedRangeFound) {
                    securityInfo += "\n";
                }
            }
            catch (...) {
                // Parsing failed
            }
        }
        else {
            return U_UNKNOWN_ITEM_TYPE;
        }
        
        // Go to next item
        prevItemOffset = itemOffset;
        prevItemSize = itemSize;
        prevItemType = itemType;
        result = findNextRawAreaItem(index, itemOffset + prevItemSize, itemType, itemOffset, itemSize, itemAltSize);
        
        // Silence value not used after assignment warning
        (void)prevItemType;
    }
    
    // Padding at the end of RAW area
    itemOffset = prevItemOffset + prevItemSize;
    if ((UINT32)data.size() > itemOffset) {
        UByteArray padding = data.mid(itemOffset);
        
        // Get info
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)", (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(headerSize + itemOffset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, index);
    }
    
    // Parse bodies
    for (int i = 0; i < model->rowCount(index); i++) {
        UModelIndex current = index.model()->index(i, 0, index);
        
        switch (model->type(current)) {
            case Types::Volume:
                parseVolumeBody(current);
                break;
            case Types::Microcode:
                // Parsing already done
                break;
            case Types::BpdtStore:
                // Parsing already done
                break;
            case Types::BpdtPartition:
                // Parsing already done
                break;
            case Types::InsydeFlashDeviceMapStore:
                // Parsing already done
                break;
            case Types::Padding:
                // No parsing required
                break;
            default:
                return U_UNKNOWN_ITEM_TYPE;
        }
    }
    
    return U_SUCCESS;
}